

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O1

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsValidCell(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  
  bVar1 = EnvironmentNAVXYTHETALATTICE::IsValidCell((EnvironmentNAVXYTHETALATTICE *)this,X,Y);
  if (bVar1) {
    if ((long)this->numofadditionalzlevs < 1) {
      bVar1 = true;
    }
    else {
      lVar2 = 0;
      do {
        bVar1 = this->AddLevelGrid2D[lVar2][X][Y] <
                (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.obsthresh;
        if (!bVar1) {
          return bVar1;
        }
        bVar3 = (long)this->numofadditionalzlevs + -1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar3);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsValidCell(int X, int Y)
{
    int levelind;

    if (!EnvironmentNAVXYTHETALAT::IsValidCell(X, Y)) return false;

    //iterate through the additional levels
    for (levelind = 0; levelind < numofadditionalzlevs; levelind++) {
        if (AddLevelGrid2D[levelind][X][Y] >= EnvNAVXYTHETALATCfg.obsthresh) return false;
    }
    //otherwise the cell is valid at all levels
    return true;
}